

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunnonlinsol_newton.c
# Opt level: O3

int SUNNonlinSolFree_Newton(SUNNonlinearSolver NLS)

{
  void *__ptr;
  
  if (NLS != (SUNNonlinearSolver)0x0) {
    __ptr = NLS->content;
    if (__ptr != (void *)0x0) {
      if (*(N_Vector *)((long)__ptr + 0x20) != (N_Vector)0x0) {
        N_VDestroy(*(N_Vector *)((long)__ptr + 0x20));
        __ptr = NLS->content;
      }
      free(__ptr);
      NLS->content = (void *)0x0;
    }
    if (NLS->ops != (_generic_SUNNonlinearSolver_Ops *)0x0) {
      free(NLS->ops);
    }
    free(NLS);
  }
  return 0;
}

Assistant:

int SUNNonlinSolFree_Newton(SUNNonlinearSolver NLS)
{
  /* return if NLS is already free */
  if (NLS == NULL)
    return(SUN_NLS_SUCCESS);

  /* free items from contents, then the generic structure */
  if (NLS->content) {

    if (NEWTON_CONTENT(NLS)->delta)
      N_VDestroy(NEWTON_CONTENT(NLS)->delta);
    NEWTON_CONTENT(NLS)->delta = NULL;

    free(NLS->content);
    NLS->content = NULL;
  }

  /* free the ops structure */
  if (NLS->ops) {
    free(NLS->ops);
    NLS->ops = NULL;
  }

  /* free the nonlinear solver */
  free(NLS);

  return(SUN_NLS_SUCCESS);
}